

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Brep.hxx
# Opt level: O0

Ref<anurbs::BrepEdge> __thiscall anurbs::Brep::edge(Brep *this,size_t index)

{
  const_reference pvVar1;
  size_type in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::BrepEdge> RVar2;
  size_t index_local;
  Brep *this_local;
  
  pvVar1 = std::
           vector<anurbs::Ref<anurbs::BrepEdge>,_std::allocator<anurbs::Ref<anurbs::BrepEdge>_>_>::
           operator[]((vector<anurbs::Ref<anurbs::BrepEdge>,_std::allocator<anurbs::Ref<anurbs::BrepEdge>_>_>
                       *)(index + 0x48),in_RDX);
  Ref<anurbs::BrepEdge>::Ref((Ref<anurbs::BrepEdge> *)this,pvVar1);
  RVar2.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar2.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::BrepEdge>)
         RVar2.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ref<BrepEdge> Brep::edge(size_t index) const
{
    return m_edges[index];
}